

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O0

cupdlp_retcode PDHG_Alloc(CUPDLPwork *w)

{
  cupdlp_retcode cVar1;
  void *pvVar2;
  undefined8 *in_RDI;
  cupdlp_float begin;
  cupdlp_retcode retcode;
  cupdlp_int in_stack_ffffffffffffffc8;
  cupdlp_int in_stack_ffffffffffffffcc;
  cupdlp_int in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int ncols;
  int iVar3;
  int in_stack_ffffffffffffffdc;
  int iVar4;
  int iVar5;
  cupdlp_retcode local_c;
  
  local_c = 0;
  pvVar2 = malloc(0x48);
  in_RDI[1] = pvVar2;
  if (in_RDI[1] == 0) {
    local_c = 1;
  }
  else {
    pvVar2 = malloc(0x188);
    in_RDI[2] = pvVar2;
    if (in_RDI[2] == 0) {
      local_c = 1;
    }
    else {
      pvVar2 = malloc(0xa0);
      in_RDI[3] = pvVar2;
      if (in_RDI[3] == 0) {
        local_c = 1;
      }
      else {
        pvVar2 = malloc(0x40);
        in_RDI[4] = pvVar2;
        if (in_RDI[4] == 0) {
          local_c = 1;
        }
        else {
          pvVar2 = malloc(0x58);
          in_RDI[6] = pvVar2;
          if (in_RDI[6] == 0) {
            local_c = 1;
          }
          else {
            cVar1 = timers_Alloc((CUPDLPtimers *)in_RDI[6]);
            if (cVar1 == 0) {
              getTimeStamp();
              pvVar2 = malloc(0x10);
              in_RDI[7] = pvVar2;
              if (in_RDI[7] == 0) {
                local_c = 1;
              }
              else {
                cVar1 = vec_Alloc((CUPDLPvec *)
                                  CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                                  in_stack_ffffffffffffffcc);
                if (cVar1 == 0) {
                  if (**(int **)*in_RDI < *(int *)(*(long *)*in_RDI + 4)) {
                    iVar5 = *(int *)(*(long *)*in_RDI + 4);
                  }
                  else {
                    iVar5 = **(int **)*in_RDI;
                  }
                  if (iVar5 < 0x800) {
                    iVar4 = 0x800;
                  }
                  else if (**(int **)*in_RDI < *(int *)(*(long *)*in_RDI + 4)) {
                    in_stack_ffffffffffffffdc = *(int *)(*(long *)*in_RDI + 4);
                    iVar4 = in_stack_ffffffffffffffdc;
                  }
                  else {
                    in_stack_ffffffffffffffdc = **(int **)*in_RDI;
                    iVar4 = in_stack_ffffffffffffffdc;
                  }
                  pvVar2 = calloc((long)iVar4,8);
                  in_RDI[8] = pvVar2;
                  if (in_RDI[8] == 0) {
                    local_c = 1;
                  }
                  else {
                    if (**(int **)*in_RDI < *(int *)(*(long *)*in_RDI + 4)) {
                      iVar3 = *(int *)(*(long *)*in_RDI + 4);
                    }
                    else {
                      iVar3 = **(int **)*in_RDI;
                    }
                    if (iVar3 < 0x800) {
                      ncols = 0x800;
                    }
                    else if (**(int **)*in_RDI < *(int *)(*(long *)*in_RDI + 4)) {
                      in_stack_ffffffffffffffd0 = *(cupdlp_int *)(*(long *)*in_RDI + 4);
                      ncols = in_stack_ffffffffffffffd0;
                    }
                    else {
                      in_stack_ffffffffffffffd0 = **(cupdlp_int **)*in_RDI;
                      ncols = in_stack_ffffffffffffffd0;
                    }
                    pvVar2 = calloc((long)ncols,8);
                    in_RDI[9] = pvVar2;
                    if (in_RDI[9] == 0) {
                      local_c = 1;
                    }
                    else {
                      pvVar2 = calloc((long)*(int *)(*(long *)*in_RDI + 4),8);
                      in_RDI[0xb] = pvVar2;
                      if (in_RDI[0xb] == 0) {
                        local_c = 1;
                      }
                      else {
                        pvVar2 = calloc((long)**(int **)*in_RDI,8);
                        in_RDI[10] = pvVar2;
                        if (in_RDI[10] == 0) {
                          local_c = 1;
                        }
                        else {
                          cVar1 = settings_Alloc((CUPDLPsettings *)in_RDI[1]);
                          if (cVar1 == 0) {
                            cVar1 = resobj_Alloc((CUPDLPresobj *)CONCAT44(iVar5,iVar4),
                                                 (CUPDLPproblem *)
                                                 CONCAT44(in_stack_ffffffffffffffdc,iVar3),ncols,
                                                 in_stack_ffffffffffffffd0);
                            if (cVar1 == 0) {
                              cVar1 = iterates_Alloc((CUPDLPiterates *)
                                                     CONCAT44(ncols,in_stack_ffffffffffffffd0),
                                                     in_stack_ffffffffffffffcc,
                                                     in_stack_ffffffffffffffc8);
                              if (cVar1 == 0) {
                                cVar1 = stepsize_Alloc((CUPDLPstepsize *)in_RDI[4]);
                                if (cVar1 != 0) {
                                  local_c = 1;
                                }
                              }
                              else {
                                local_c = 1;
                              }
                            }
                            else {
                              local_c = 1;
                            }
                          }
                          else {
                            local_c = 1;
                          }
                        }
                      }
                    }
                  }
                }
                else {
                  local_c = 1;
                }
              }
            }
            else {
              local_c = 1;
            }
          }
        }
      }
    }
  }
  return local_c;
}

Assistant:

cupdlp_retcode PDHG_Alloc(CUPDLPwork *w) {
  cupdlp_retcode retcode = RETCODE_OK;

  CUPDLP_INIT_SETTINGS(w->settings, 1);
  CUPDLP_INIT_RESOBJ(w->resobj, 1);
  CUPDLP_INIT_ITERATES(w->iterates, 1);
  CUPDLP_INIT_STEPSIZE(w->stepsize, 1);

  CUPDLP_INIT_TIMERS(w->timers, 1);
  CUPDLP_CALL(timers_Alloc(w->timers));

  cupdlp_float begin = getTimeStamp();
  // buffer
  CUPDLP_INIT_CUPDLP_VEC(w->buffer, 1);
  CUPDLP_CALL(vec_Alloc(w->buffer, w->problem->data->nRows));


  cupdlp_init_zero_vec_double(w->buffer2,
                       MAX(2048, MAX(w->problem->data->nCols, w->problem->data->nRows)));
#if defined(CUPDLP_CPU) || !(USE_KERNELS) || (CUPDLP_DUMP_LINESEARCH_STATS && CUPDLP_DEBUG)
  cupdlp_init_zero_vec_double(w->buffer3,
                       MAX(2048, MAX(w->problem->data->nCols, w->problem->data->nRows)));
#else
  w->buffer3 = NULL;
#endif

  // for scaling
  cupdlp_init_zero_vec_double(w->colScale, w->problem->data->nCols);
  cupdlp_init_zero_vec_double(w->rowScale, w->problem->data->nRows);

  CUPDLP_CALL(settings_Alloc(w->settings));
  CUPDLP_CALL(resobj_Alloc(w->resobj, w->problem, w->problem->data->nCols,
                           w->problem->data->nRows));
  CUPDLP_CALL(iterates_Alloc(w->iterates, w->problem->data->nCols,
                             w->problem->data->nRows));
  CUPDLP_CALL(stepsize_Alloc(w->stepsize));

#ifndef CUPDLP_CPU
  //   CHECK_CUSPARSE(cusparseCreate(&w->cusparsehandle));
  //   CHECK_CUBLAS(cublasCreate(&w->cublashandle));
  CUPDLP_CALL(cuda_alloc_MVbuffer(
      //   w->problem->data->matrix_format,
      w->cusparsehandle, w->problem->data->csc_matrix->cuda_csc,
      w->iterates->x[0]->cuda_vec, w->iterates->ax[0]->cuda_vec,
      w->problem->data->csr_matrix->cuda_csr, w->iterates->y[0]->cuda_vec,
      w->iterates->aty[0]->cuda_vec, &w->dBuffer_csc_ATy, &w->dBuffer_csr_Ax))
  w->timers->AllocMem_CopyMatToDeviceTime += getTimeStamp() - begin;
#endif

exit_cleanup:
  return retcode;
}